

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

void __thiscall Reader::processconsec(Reader *this)

{
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  *this_00;
  LpSectionKeyword LVar1;
  iterator end;
  ProcessedToken *pPVar2;
  size_type sVar3;
  mapped_type *it;
  mapped_type *pmVar4;
  Constraint *this_01;
  mapped_type *pmVar5;
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 aVar6;
  key_type local_64;
  shared_ptr<Constraint> con;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = &this->sectiontokens;
  con.super___shared_ptr<Constraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 3;
  sVar3 = std::
          map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
          ::count(this_00,(key_type *)&con);
  if (sVar3 != 0) {
    con.super___shared_ptr<Constraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 3;
    it = std::
         map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
         ::operator[](this_00,(key_type *)&con);
    con.super___shared_ptr<Constraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 3;
    pmVar4 = std::
             map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
             ::operator[](this_00,(key_type *)&con);
    while ((it->first)._M_current != (pmVar4->second)._M_current) {
      this_01 = (Constraint *)operator_new(0x20);
      Constraint::Constraint(this_01);
      std::__shared_ptr<Constraint,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Constraint,void>
                ((__shared_ptr<Constraint,(__gnu_cxx::_Lock_policy)2> *)&con,this_01);
      end._M_current = (pmVar4->second)._M_current;
      std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 (__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> *)
                 (CONCAT44(con.super___shared_ptr<Constraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                           _4_4_,con.super___shared_ptr<Constraint,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr._0_4_) + 0x10));
      parseexpression(this,&it->first,end,(shared_ptr<Expression> *)&local_40,false);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      local_64 = CON;
      pmVar5 = std::
               map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
               ::operator[](this_00,&local_64);
      lpassert((it->first)._M_current != (pmVar5->second)._M_current);
      lpassert(((it->first)._M_current)->type == COMP);
      pPVar2 = (it->first)._M_current;
      LVar1 = (pPVar2->field_1).keyword;
      (it->first)._M_current = pPVar2 + 1;
      local_64 = CON;
      pmVar5 = std::
               map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
               ::operator[](this_00,&local_64);
      lpassert((it->first)._M_current != (pmVar5->second)._M_current);
      lpassert(((it->first)._M_current)->type == CONST);
      if (LVar1 == NONE) {
        *(anon_union_8_5_ebd6940d_for_ProcessedToken_1 *)
         (CONCAT44(con.super___shared_ptr<Constraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                   con.super___shared_ptr<Constraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_) + 8)
             = ((it->first)._M_current)->field_1;
      }
      else {
        if (LVar1 == OBJMAX) {
          aVar6 = ((it->first)._M_current)->field_1;
          *(anon_union_8_5_ebd6940d_for_ProcessedToken_1 *)
           (CONCAT44(con.super___shared_ptr<Constraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                     con.super___shared_ptr<Constraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_) +
           8) = aVar6;
        }
        else {
          if (LVar1 != BOUNDS) {
            lpassert(false);
            goto LAB_0021069d;
          }
          aVar6 = ((it->first)._M_current)->field_1;
        }
        *(anon_union_8_5_ebd6940d_for_ProcessedToken_1 *)
         CONCAT44(con.super___shared_ptr<Constraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                  con.super___shared_ptr<Constraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_) =
             aVar6;
      }
LAB_0021069d:
      std::vector<std::shared_ptr<Constraint>,_std::allocator<std::shared_ptr<Constraint>_>_>::
      push_back(&(this->builder).model.constraints,&con);
      (it->first)._M_current = (it->first)._M_current + 1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&con.super___shared_ptr<Constraint,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  return;
}

Assistant:

void Reader::processconsec() {
  if (!sectiontokens.count(LpSectionKeyword::CON)) return;
  std::vector<ProcessedToken>::iterator& begin(
      sectiontokens[LpSectionKeyword::CON].first);
  std::vector<ProcessedToken>::iterator& end(
      sectiontokens[LpSectionKeyword::CON].second);
  while (begin != end) {
    std::shared_ptr<Constraint> con =
        std::shared_ptr<Constraint>(new Constraint);
    parseexpression(begin, end, con->expr, false);
    // should not be at end of section yet, but a comparison operator should be
    // next
    lpassert(begin != sectiontokens[LpSectionKeyword::CON].second);
    lpassert(begin->type == ProcessedTokenType::COMP);
    LpComparisonType dir = begin->dir;
    ++begin;

    // should still not be at end of section yet, but a right-hand-side value
    // should be next
    lpassert(begin != sectiontokens[LpSectionKeyword::CON].second);
    lpassert(begin->type == ProcessedTokenType::CONST);
    switch (dir) {
      case LpComparisonType::EQ:
        con->lowerbound = con->upperbound = begin->value;
        break;
      case LpComparisonType::LEQ:
        con->upperbound = begin->value;
        break;
      case LpComparisonType::GEQ:
        con->lowerbound = begin->value;
        break;
      default:
        lpassert(false);
    }
    builder.model.constraints.push_back(con);
    ++begin;
  }
}